

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O0

REF_STATUS ref_sort_in_place_glob(REF_INT n,REF_GLOB *sorts)

{
  REF_INT *sorted_index;
  void *__ptr;
  REF_STATUS ref_private_macro_code_rss;
  REF_GLOB *sorted;
  REF_INT *order;
  REF_INT i;
  REF_GLOB *sorts_local;
  REF_INT n_local;
  
  if (n < 2) {
    sorts_local._4_4_ = 0;
  }
  else if (n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",199,
           "ref_sort_in_place_glob","malloc order of REF_INT negative");
    sorts_local._4_4_ = 1;
  }
  else {
    sorted_index = (REF_INT *)malloc((long)n << 2);
    if (sorted_index == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",199,
             "ref_sort_in_place_glob","malloc order of REF_INT NULL");
      sorts_local._4_4_ = 2;
    }
    else if (n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",200,
             "ref_sort_in_place_glob","malloc sorted of REF_GLOB negative");
      sorts_local._4_4_ = 1;
    }
    else {
      __ptr = malloc((long)n << 3);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",200,
               "ref_sort_in_place_glob","malloc sorted of REF_GLOB NULL");
        sorts_local._4_4_ = 2;
      }
      else {
        sorts_local._4_4_ = ref_sort_heap_glob(n,sorts,sorted_index);
        if (sorts_local._4_4_ == 0) {
          for (order._4_4_ = 0; order._4_4_ < n; order._4_4_ = order._4_4_ + 1) {
            *(REF_GLOB *)((long)__ptr + (long)order._4_4_ * 8) = sorts[sorted_index[order._4_4_]];
          }
          for (order._4_4_ = 0; order._4_4_ < n; order._4_4_ = order._4_4_ + 1) {
            sorts[order._4_4_] = *(REF_GLOB *)((long)__ptr + (long)order._4_4_ * 8);
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          if (sorted_index != (REF_INT *)0x0) {
            free(sorted_index);
          }
          sorts_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",
                 0xc9,"ref_sort_in_place_glob",(ulong)sorts_local._4_4_,"heap");
        }
      }
    }
  }
  return sorts_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_sort_in_place_glob(REF_INT n, REF_GLOB *sorts) {
  REF_INT i;
  REF_INT *order;
  REF_GLOB *sorted;

  /* see if it is too short to require sorting */
  if (2 > n) return REF_SUCCESS;
  ref_malloc(order, n, REF_INT);
  ref_malloc(sorted, n, REF_GLOB);
  RSS(ref_sort_heap_glob(n, sorts, order), "heap");
  for (i = 0; i < n; i++) {
    sorted[i] = sorts[order[i]];
  }
  for (i = 0; i < n; i++) {
    sorts[i] = sorted[i];
  }
  ref_free(sorted);
  ref_free(order);
  return REF_SUCCESS;
}